

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall Darts::Details::DawgBuilder::expand_table(DawgBuilder *this)

{
  bool bVar1;
  id_type iVar2;
  DawgBuilder *pDVar3;
  uchar *puVar4;
  DawgUnit *this_00;
  uint *puVar5;
  AutoPool<unsigned_int> *in_RDI;
  id_type hash_id;
  id_type id;
  size_t i;
  size_t table_size;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffc8;
  DawgBuilder *pDVar6;
  DawgBuilder *this_01;
  
  AutoPool<unsigned_int>::size(in_RDI + 5);
  AutoPool<unsigned_int>::clear
            ((AutoPool<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
            );
  AutoPool<unsigned_int>::resize
            (in_RDI,in_stack_ffffffffffffffc8,
             (uint *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pDVar6 = (DawgBuilder *)0x1;
  do {
    this_01 = pDVar6;
    pDVar3 = (DawgBuilder *)
             AutoPool<Darts::Details::DawgUnit>::size
                       ((AutoPool<Darts::Details::DawgUnit> *)(in_RDI + 1));
    if (pDVar3 <= pDVar6) {
      return;
    }
    iVar2 = (id_type)this_01;
    puVar4 = AutoPool<unsigned_char>::operator[]
                       ((AutoPool<unsigned_char> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (*puVar4 == '\0') {
LAB_0047b80b:
      in_stack_ffffffffffffffc4 = iVar2;
      find_unit(this_01,in_stack_ffffffffffffffc4,(id_type *)in_RDI);
      puVar5 = AutoPool<unsigned_int>::operator[]
                         ((AutoPool<unsigned_int> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      *puVar5 = in_stack_ffffffffffffffc4;
    }
    else {
      this_00 = AutoPool<Darts::Details::DawgUnit>::operator[]
                          ((AutoPool<Darts::Details::DawgUnit> *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8);
      bVar1 = DawgUnit::is_state(this_00);
      if (bVar1) goto LAB_0047b80b;
    }
    pDVar6 = (DawgBuilder *)((long)&(this_01->nodes_).buf_.array_ + 1);
  } while( true );
}

Assistant:

inline void DawgBuilder::expand_table() {
  std::size_t table_size = table_.size() << 1;
  table_.clear();
  table_.resize(table_size, 0);

  for (std::size_t i = 1; i < units_.size(); ++i) {
    id_type id = static_cast<id_type>(i);
    if (labels_[id] == '\0' || units_[id].is_state()) {
      id_type hash_id;
      find_unit(id, &hash_id);
      table_[hash_id] = id;
    }
  }
}